

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int repeat_segment_start(mixed_segment *segment)

{
  long *plVar1;
  repeat_segment_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  if ((*plVar1 == 0) || (plVar1[1] == 0)) {
    mixed_err(0x16);
    segment_local._4_4_ = 0;
  }
  else {
    *(undefined4 *)((long)plVar1 + 0x1c) = 0;
    segment_local._4_4_ = 1;
  }
  return segment_local._4_4_;
}

Assistant:

int repeat_segment_start(struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  if (data->in == 0 || data->out == 0) {
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  data->buffer_index = 0;
  return 1;
}